

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpClient.cpp
# Opt level: O1

void __thiscall
sznet::net::TcpClient::TcpClient
          (TcpClient *this,EventLoop *loop,InetAddress *serverAddr,string *nameArg)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  element_type *peVar3;
  ulong __n;
  EventLoop *pEVar4;
  Connector *this_00;
  undefined8 *puVar5;
  EventLoop *in_R9;
  int iVar6;
  SourceFile file;
  SourceFile file_00;
  undefined1 local_1018 [24];
  code *pcStack_1000;
  char *local_68 [5];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_40;
  string *local_38;
  
  file._8_8_ = 0x2c;
  file.m_data = (char *)0xd;
  pEVar4 = CheckNotNull<sznet::net::EventLoop>((sznet *)0x12b9b6,file,0x12b9c4,(char *)loop,in_R9);
  this->m_loop = pEVar4;
  this_00 = (Connector *)operator_new(0x70);
  Connector::Connector(this_00,loop,serverAddr);
  std::__shared_ptr<sznet::net::Connector,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<sznet::net::Connector,void>
            ((__shared_ptr<sznet::net::Connector,(__gnu_cxx::_Lock_policy)2> *)&this->m_connector,
             this_00);
  paVar1 = &(this->m_name).field_2;
  (this->m_name)._M_dataplus._M_p = (pointer)paVar1;
  pcVar2 = (nameArg->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_name,pcVar2,pcVar2 + nameArg->_M_string_length);
  *(undefined8 *)&(this->m_connectionCallback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_connectionCallback).super__Function_base._M_functor + 8) = 0;
  (this->m_connectionCallback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_connectionCallback)._M_invoker = (_Invoker_type)0x0;
  *(undefined8 *)&(this->m_messageCallback).super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->m_messageCallback).super__Function_base._M_functor + 8) = 0;
  (this->m_messageCallback).super__Function_base._M_manager = (_Manager_type)0x0;
  (this->m_messageCallback)._M_invoker = (_Invoker_type)0x0;
  *(code **)&(this->m_connectionCallback).super__Function_base._M_functor =
       defaultConnectionCallback;
  (this->m_connectionCallback)._M_invoker =
       std::
       _Function_handler<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&),_void_(*)(const_std::shared_ptr<sznet::net::TcpConnection>_&)>
       ::_M_invoke;
  (this->m_connectionCallback).super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&),_void_(*)(const_std::shared_ptr<sznet::net::TcpConnection>_&)>
       ::_M_manager;
  *(code **)&(this->m_messageCallback).super__Function_base._M_functor = defaultMessageCallback;
  (this->m_messageCallback)._M_invoker =
       std::
       _Function_handler<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp),_void_(*)(const_std::shared_ptr<sznet::net::TcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
       ::_M_invoke;
  (this->m_messageCallback).super__Function_base._M_manager =
       std::
       _Function_handler<void_(const_std::shared_ptr<sznet::net::TcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp),_void_(*)(const_std::shared_ptr<sznet::net::TcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
       ::_M_manager;
  this->m_writeCompleteCallback = (WriteCompleteCallback)(ZEXT432(0) << 0x40);
  this->m_retry = false;
  this->m_connect = true;
  this->m_nextConnId = 1;
  (this->m_mutex).m_holder = 0;
  local_40 = paVar1;
  sz_mutex_init(&(this->m_mutex).m_mutex);
  (this->m_connection).super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)0x0;
  (this->m_connection).super___shared_ptr<sznet::net::TcpConnection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar3 = (this->m_connector).super___shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  _local_1018 = (function<void_(int)>)(ZEXT432(0) << 0x40);
  puVar5 = (undefined8 *)operator_new(0x18);
  *puVar5 = newConnection;
  puVar5[1] = 0;
  puVar5[2] = this;
  local_1018._0_8_ = puVar5;
  local_1018._16_8_ =
       std::
       _Function_handler<void_(int),_std::_Bind<void_(sznet::net::TcpClient::*(sznet::net::TcpClient_*,_std::_Placeholder<1>))(int)>_>
       ::_M_manager;
  pcStack_1000 = std::
                 _Function_handler<void_(int),_std::_Bind<void_(sznet::net::TcpClient::*(sznet::net::TcpClient_*,_std::_Placeholder<1>))(int)>_>
                 ::_M_invoke;
  std::function<void_(int)>::operator=
            (&peVar3->m_newConnectionCallback,(function<void_(int)> *)local_1018);
  if ((_Manager_type)local_1018._16_8_ != (_Manager_type)0x0) {
    (*(code *)local_1018._16_8_)((_Any_data *)local_1018,(_Any_data *)local_1018,__destroy_functor);
  }
  if (g_logLevel < 3) {
    file_00._8_8_ = 0xd;
    file_00.m_data = "TcpClient.cpp";
    local_38 = &this->m_name;
    Logger::Logger((Logger *)local_1018,file_00,0x37);
    iVar6 = (int)local_68;
    if (0x15 < (uint)(iVar6 - (int)local_68[0])) {
      builtin_strncpy(local_68[0],"TcpClient::TcpClient[",0x15);
      local_68[0] = local_68[0] + 0x15;
    }
    __n = (this->m_name)._M_string_length;
    if (__n < (ulong)(long)(iVar6 - (int)local_68[0])) {
      memcpy(local_68[0],(local_38->_M_dataplus)._M_p,__n);
      local_68[0] = local_68[0] + __n;
    }
    if (0xe < (uint)(iVar6 - (int)local_68[0])) {
      builtin_strncpy(local_68[0],"] - connector ",0xe);
      local_68[0] = local_68[0] + 0xe;
    }
    LogStream::operator<<
              ((LogStream *)(local_1018 + 8),
               (this->m_connector).
               super___shared_ptr<sznet::net::Connector,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    Logger::~Logger((Logger *)local_1018);
  }
  return;
}

Assistant:

TcpClient::TcpClient(EventLoop* loop, const InetAddress& serverAddr, const string& nameArg): 
	m_loop(CHECK_NOTNULL(loop)),
    m_connector(new Connector(loop, serverAddr)),
    m_name(nameArg),
    m_connectionCallback(defaultConnectionCallback),
    m_messageCallback(defaultMessageCallback),
    m_retry(false),
    m_connect(true),
    m_nextConnId(1)
{
	m_connector->setNewConnectionCallback(std::bind(&TcpClient::newConnection, this, std::placeholders::_1));
	// FIXME setConnectFailedCallback
	LOG_INFO << "TcpClient::TcpClient[" << m_name 
		<< "] - connector " << get_pointer(m_connector);
}